

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::~PathTracer(PathTracer *this)

{
  BVHAccel *this_00;
  PathTracer *this_local;
  
  this_00 = this->bvh;
  if (this_00 != (BVHAccel *)0x0) {
    StaticScene::BVHAccel::~BVHAccel(this_00);
    operator_delete(this_00,0x28);
  }
  if (this->gridSampler != (Sampler2D *)0x0) {
    (*this->gridSampler->_vptr_Sampler2D[1])();
  }
  if (this->hemisphereSampler != (Sampler3D *)0x0) {
    (*this->hemisphereSampler->_vptr_Sampler3D[1])();
  }
  std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::~vector(&this->rayLog);
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::~stack(&this->selectionHistory);
  WorkQueue<CMU462::WorkItem>::~WorkQueue(&this->workQueue);
  std::vector<std::thread_*,_std::allocator<std::thread_*>_>::~vector(&this->workerThreads);
  ImageBuffer::~ImageBuffer(&this->frameBuffer);
  HDRImageBuffer::~HDRImageBuffer(&this->sampleBuffer);
  std::vector<int,_std::allocator<int>_>::~vector(&this->tile_samples);
  return;
}

Assistant:

PathTracer::~PathTracer() {

    delete bvh;
    delete gridSampler;
    delete hemisphereSampler;

  }